

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.cpp
# Opt level: O3

void __thiscall
OpenMD::MolecularRestraint::calcForce
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *struc,
          Vector3d *molCom)

{
  uint i;
  long lVar1;
  mapped_type *pmVar2;
  pointer pVVar3;
  double *pdVar4;
  uint i_13;
  pointer pVVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  pointer pVVar9;
  ulong uVar10;
  uint j;
  long lVar11;
  double *pdVar12;
  uint i_18;
  undefined1 *puVar13;
  double (*padVar14) [3];
  uint k;
  double ***pppdVar15;
  long lVar16;
  uint i_9;
  uint i_7;
  DynamicRectMatrix<double> *this_00;
  double tmp;
  double dVar17;
  double dVar18;
  double dVar19;
  Vector<double,_3U> result_8;
  Vector<double,_3U> result_11;
  Vector<double,_3U> result;
  DynamicVector<double,_std::allocator<double>_> stmp;
  DynamicRectMatrix<double> wtmp;
  DynamicRectMatrix<double> vtmp;
  DynamicRectMatrix<double> Rtmp;
  Vector<double,_3U> result_1;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Mat3x3d R;
  SVD<double> svd;
  RotMat3x3d Atrans;
  Quat4d quat;
  RotMat3x3d A;
  double local_338 [4];
  double local_318 [4];
  undefined1 local_2f8 [8];
  double adStack_2f0 [9];
  double local_2a8 [4];
  vector<double,_std::allocator<double>_> local_288;
  DynamicRectMatrix<double> local_268;
  DynamicRectMatrix<double> local_258;
  DynamicRectMatrix<double> local_248;
  double local_238 [10];
  double local_1e8;
  double local_1e0;
  double local_1d8 [4];
  double **local_1b8;
  double adStack_1b0 [9];
  double local_168 [4];
  double local_148 [4];
  SVD<double> local_128;
  double local_e8 [10];
  Quaternion<double> local_98;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (this->super_Restraint).pot_ = 0.0;
  pVVar5 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = (this->forces_).
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (pVVar9 = pVVar3; pVVar9 != pVVar5; pVVar9 = pVVar9 + 1) {
    (pVVar9->super_Vector<double,_3U>).data_[0] = 0.0;
    (pVVar9->super_Vector<double,_3U>).data_[1] = 0.0;
    (pVVar9->super_Vector<double,_3U>).data_[2] = 0.0;
  }
  uVar8 = (this->super_Restraint).restType_;
  if ((uVar8 & 1) != 0) {
    local_2f8 = (undefined1  [8])0x0;
    adStack_2f0[0] = 0.0;
    adStack_2f0[1] = 0.0;
    lVar1 = 0;
    do {
      *(double *)(local_2f8 + lVar1 * 8) =
           (molCom->super_Vector<double,_3U>).data_[lVar1] -
           (this->refCom_).super_Vector<double,_3U>.data_[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    adStack_1b0[1] = adStack_2f0[1];
    local_1b8 = (double **)local_2f8;
    adStack_1b0[0] = adStack_2f0[0];
    dVar17 = 0.0;
    lVar1 = 0;
    do {
      dVar17 = dVar17 + (double)(&local_1b8)[lVar1] * (double)(&local_1b8)[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    if (dVar17 < 0.0) {
      dVar17 = sqrt(dVar17);
    }
    else {
      dVar17 = SQRT(dVar17);
    }
    dVar18 = (this->super_Restraint).kDisp_ * 0.5 * dVar17 * dVar17;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar18;
    if ((this->super_Restraint).printRest_ == true) {
      local_2f8._0_4_ = 1;
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_2f8);
      pmVar2->first = dVar17;
      pmVar2->second = dVar18;
    }
    pVVar5 = (this->forces_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar3 = (this->forces_).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    for (pVVar9 = pVVar3; pVVar9 != pVVar5; pVVar9 = pVVar9 + 1) {
      dVar17 = (this->super_Restraint).kDisp_;
      local_238[0] = 0.0;
      local_238[1] = 0.0;
      local_238[2] = 0.0;
      lVar1 = 0;
      do {
        local_238[lVar1] = (double)(&local_1b8)[lVar1] * -dVar17;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      dVar17 = (this->super_Restraint).scaleFactor_;
      local_2f8 = (undefined1  [8])0x0;
      adStack_2f0[0] = 0.0;
      adStack_2f0[1] = 0.0;
      lVar1 = 0;
      do {
        *(double *)(local_2f8 + lVar1 * 8) = local_238[lVar1] * dVar17;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      lVar1 = 0;
      do {
        (pVVar9->super_Vector<double,_3U>).data_[lVar1] =
             *(double *)(local_2f8 + lVar1 * 8) + (pVVar9->super_Vector<double,_3U>).data_[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
    }
    uVar8 = (this->super_Restraint).restType_;
  }
  if ((uVar8 & 2) != 0) {
    dVar18 = (molCom->super_Vector<double,_3U>).data_[2] - (this->super_Restraint).posZ0_;
    dVar17 = (this->super_Restraint).kAbs_;
    dVar19 = dVar17 * 0.5 * dVar18 * dVar18;
    local_1b8 = (double **)0x0;
    adStack_1b0[0] = 0.0;
    adStack_1b0[1] = -dVar17 * dVar18;
    (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar19;
    if ((this->super_Restraint).printRest_ == true) {
      local_2f8._0_4_ = 2;
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_2f8);
      pmVar2->first = dVar18;
      pmVar2->second = dVar19;
      pVVar3 = (this->forces_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar5 = (this->forces_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; pVVar3 != pVVar5; pVVar3 = pVVar3 + 1) {
      dVar17 = (this->super_Restraint).scaleFactor_;
      local_2f8 = (undefined1  [8])0x0;
      adStack_2f0[0] = 0.0;
      adStack_2f0[1] = 0.0;
      lVar1 = 0;
      do {
        *(double *)(local_2f8 + lVar1 * 8) = (double)(&local_1b8)[lVar1] * dVar17;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      lVar1 = 0;
      do {
        (pVVar3->super_Vector<double,_3U>).data_[lVar1] =
             *(double *)(local_2f8 + lVar1 * 8) + (pVVar3->super_Vector<double,_3U>).data_[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
    }
    uVar8 = (this->super_Restraint).restType_;
  }
  if (3 < (int)uVar8) {
    local_2a8[0] = 0.0;
    local_2a8[1] = 0.0;
    uVar7 = 0;
    local_2a8[2] = 0.0;
    adStack_1b0[7] = 0.0;
    adStack_1b0[5] = 0.0;
    adStack_1b0[6] = 0.0;
    adStack_1b0[3] = 0.0;
    adStack_1b0[4] = 0.0;
    adStack_1b0[1] = 0.0;
    adStack_1b0[2] = 0.0;
    local_1b8 = (double **)0x0;
    adStack_1b0[0] = 0.0;
    pVVar3 = (struc->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = (long)(struc->
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
    if (lVar1 != 0) {
      uVar10 = (lVar1 >> 3) * -0x5555555555555555;
      pVVar5 = (this->ref_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar1 = 0;
        do {
          pVVar3[uVar7].super_Vector<double,_3U>.data_[lVar1] =
               pVVar3[uVar7].super_Vector<double,_3U>.data_[lVar1] -
               (molCom->super_Vector<double,_3U>).data_[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        adStack_2f0[5] = 0.0;
        adStack_2f0[6] = 0.0;
        adStack_2f0[3] = 0.0;
        adStack_2f0[4] = 0.0;
        adStack_2f0[1] = 0.0;
        adStack_2f0[2] = 0.0;
        local_2f8 = (undefined1  [8])0x0;
        adStack_2f0[0] = 0.0;
        adStack_2f0[7] = 0.0;
        lVar1 = 0;
        puVar13 = local_2f8;
        do {
          dVar17 = pVVar3[uVar7].super_Vector<double,_3U>.data_[lVar1];
          lVar11 = 0;
          do {
            *(double *)(puVar13 + lVar11 * 8) =
                 pVVar5[uVar7].super_Vector<double,_3U>.data_[lVar11] * dVar17;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar1 = lVar1 + 1;
          puVar13 = puVar13 + 0x18;
        } while (lVar1 != 3);
        lVar1 = 0;
        puVar13 = local_2f8;
        pppdVar15 = &local_1b8;
        do {
          lVar11 = 0;
          do {
            pppdVar15[lVar11] =
                 (double **)(*(double *)(puVar13 + lVar11 * 8) + (double)pppdVar15[lVar11]);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar1 = lVar1 + 1;
          pppdVar15 = pppdVar15 + 3;
          puVar13 = puVar13 + 0x18;
        } while (lVar1 != 3);
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 <= uVar10 && uVar10 - uVar7 != 0);
    }
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_248,3,3,0.0);
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_258,3,3);
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x18);
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + 3;
    *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = 0.0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = 0.0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = 0.0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    DynamicRectMatrix<double>::DynamicRectMatrix(&local_268,3,3);
    lVar1 = 0;
    do {
      pdVar4 = *local_248.data_;
      pdVar4[2] = adStack_1b0[lVar1 + 1];
      dVar17 = adStack_1b0[lVar1];
      *pdVar4 = (double)(&local_1b8)[lVar1];
      pdVar4[1] = dVar17;
      local_248.data_ = local_248.data_ + 1;
      lVar1 = lVar1 + 3;
    } while (lVar1 != 9);
    JAMA::SVD<double>::SVD(&local_128,&local_248);
    JAMA::SVD<double>::getU(&local_128,&local_258);
    std::vector<double,_std::allocator<double>_>::operator=(&local_288,&local_128.s.data_);
    DynamicRectMatrix<double>::operator=((DynamicRectMatrix<double> *)local_2f8,&local_268);
    this_00 = (DynamicRectMatrix<double> *)local_2f8;
    DynamicRectMatrix<double>::deallocate(this_00);
    lVar1 = 0;
    adStack_2f0[7] = 0.0;
    adStack_2f0[5] = 0.0;
    adStack_2f0[6] = 0.0;
    adStack_2f0[3] = 0.0;
    adStack_2f0[4] = 0.0;
    adStack_2f0[1] = 0.0;
    adStack_2f0[2] = 0.0;
    local_2f8 = (undefined1  [8])0x0;
    adStack_2f0[0] = 0.0;
    local_238[8] = 0.0;
    local_238[6] = 0.0;
    local_238[7] = 0.0;
    local_238[4] = 0.0;
    local_238[5] = 0.0;
    local_238[2] = 0.0;
    local_238[3] = 0.0;
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    do {
      pdVar4 = *local_258.data_;
      adStack_2f0[lVar1 + 1] = pdVar4[2];
      dVar17 = pdVar4[1];
      *(double *)(local_2f8 + lVar1 * 8) = *pdVar4;
      adStack_2f0[lVar1] = dVar17;
      local_258.data_ = local_258.data_ + 1;
      lVar1 = lVar1 + 3;
    } while (lVar1 != 9);
    lVar1 = 0;
    do {
      pdVar4 = *local_268.data_;
      local_238[lVar1 + 2] = pdVar4[2];
      dVar17 = pdVar4[1];
      local_238[lVar1] = *pdVar4;
      local_238[lVar1 + 1] = dVar17;
      local_268.data_ = local_268.data_ + 1;
      lVar1 = lVar1 + 3;
    } while (lVar1 != 9);
    if ((local_238[2] * (local_238[3] * local_238[7] - local_238[6] * local_238[4]) +
        local_238[1] * (local_238[5] * local_238[6] - local_238[8] * local_238[3]) +
        local_238[0] * (local_238[4] * local_238[8] - local_238[7] * local_238[5])) *
        (adStack_2f0[1] * (adStack_2f0[2] * adStack_2f0[6] - adStack_2f0[5] * adStack_2f0[3]) +
        adStack_2f0[0] * (adStack_2f0[4] * adStack_2f0[5] - adStack_2f0[7] * adStack_2f0[2]) +
        (double)local_2f8 * (adStack_2f0[3] * adStack_2f0[7] - adStack_2f0[6] * adStack_2f0[4])) <
        0.0) {
      adStack_2f0[5] = -adStack_2f0[5];
      adStack_2f0[6] = -adStack_2f0[6];
      adStack_2f0[7] = -adStack_2f0[7];
    }
    pdVar4 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_38 = 0;
    pdVar6 = local_238;
    lVar1 = 0;
    do {
      lVar11 = 0;
      pdVar12 = pdVar4;
      do {
        *pdVar12 = pdVar6[lVar11];
        lVar11 = lVar11 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar11 != 3);
      lVar1 = lVar1 + 1;
      pdVar4 = pdVar4 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar1 != 3);
    local_e8[6] = 0.0;
    local_e8[7] = 0.0;
    local_e8[4] = 0.0;
    local_e8[5] = 0.0;
    local_e8[2] = 0.0;
    local_e8[3] = 0.0;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_e8[8] = 0.0;
    lVar1 = 0;
    do {
      lVar11 = 0;
      pdVar4 = &local_78;
      do {
        dVar17 = local_e8[lVar1 * 3 + lVar11];
        lVar16 = 0;
        pdVar6 = pdVar4;
        do {
          dVar17 = dVar17 + (double)(&this_00->data_)[lVar16] * *pdVar6;
          lVar16 = lVar16 + 1;
          pdVar6 = pdVar6 + 3;
        } while (lVar16 != 3);
        local_e8[lVar1 * 3 + lVar11] = dVar17;
        lVar11 = lVar11 + 1;
        pdVar4 = pdVar4 + 1;
      } while (lVar11 != 3);
      lVar1 = lVar1 + 1;
      this_00 = (DynamicRectMatrix<double> *)&this_00[1].nrow_;
    } while (lVar1 != 3);
    pdVar4 = &local_78;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0.0;
    uStack_60 = 0;
    local_78 = 0.0;
    dStack_70 = 0.0;
    local_38 = 0;
    pdVar6 = local_e8;
    lVar1 = 0;
    do {
      lVar11 = 0;
      pdVar12 = pdVar4;
      do {
        *pdVar12 = pdVar6[lVar11];
        lVar11 = lVar11 + 1;
        pdVar12 = pdVar12 + 3;
      } while (lVar11 != 3);
      lVar1 = lVar1 + 1;
      pdVar4 = pdVar4 + 1;
      pdVar6 = pdVar6 + 3;
    } while (lVar1 != 3);
    SquareMatrix3<double>::toQuaternion(&local_98,(SquareMatrix3<double> *)&local_78);
    Quaternion<double>::toTwistSwing(&local_98,&local_1e0,&local_1e8,local_238 + 9);
    uVar8 = (this->super_Restraint).restType_;
    if ((uVar8 & 4) != 0) {
      dVar18 = local_1e0 - (this->super_Restraint).twist0_;
      dVar17 = (this->super_Restraint).kTwist_;
      dVar19 = dVar17 * 0.5 * dVar18 * dVar18;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar19;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_338 + lVar1) =
             *(double *)((long)&OpenMD::V3Z + lVar1) * dVar17 * dVar18;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_2a8[lVar1] = local_2a8[lVar1] - local_338[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,4);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar2->first = local_1e0;
        pmVar2->second = dVar19;
        uVar8 = (this->super_Restraint).restType_;
      }
    }
    if ((uVar8 & 8) != 0) {
      dVar18 = local_1e8 - (this->super_Restraint).swingX0_;
      dVar17 = (this->super_Restraint).kSwingX_;
      dVar19 = dVar17 * 0.5 * dVar18 * dVar18;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar19;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_338 + lVar1) =
             *(double *)((long)&OpenMD::V3X + lVar1) * dVar17 * dVar18;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_2a8[lVar1] = local_2a8[lVar1] - local_338[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,8);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar2->first = local_1e8;
        pmVar2->second = dVar19;
        uVar8 = (this->super_Restraint).restType_;
      }
    }
    if ((uVar8 & 0x10) != 0) {
      dVar18 = local_238[9] - (this->super_Restraint).swingY0_;
      dVar17 = (this->super_Restraint).kSwingY_;
      dVar19 = (this->super_Restraint).kSwingX_ * 0.5 * dVar18 * dVar18;
      (this->super_Restraint).pot_ = (this->super_Restraint).pot_ + dVar19;
      local_338[0] = 0.0;
      local_338[1] = 0.0;
      local_338[2] = 0.0;
      lVar1 = 0;
      do {
        *(double *)((long)local_338 + lVar1) =
             *(double *)((long)&OpenMD::V3Y + lVar1) * dVar17 * dVar18;
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x18);
      lVar1 = 0;
      do {
        local_2a8[lVar1] = local_2a8[lVar1] - local_338[lVar1];
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      if ((this->super_Restraint).printRest_ == true) {
        local_338[0] = (double)CONCAT44(local_338[0]._4_4_,0x10);
        pmVar2 = std::
                 map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                 ::operator[](&(this->super_Restraint).restInfo_,(key_type *)local_338);
        pmVar2->first = local_238[9];
        pmVar2->second = dVar19;
      }
    }
    dVar17 = 0.0;
    lVar1 = 0;
    do {
      dVar17 = dVar17 + local_2a8[lVar1] * local_2a8[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    pVVar3 = (struc->
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    lVar1 = (long)(struc->
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
    if (lVar1 != 0) {
      uVar7 = (lVar1 >> 3) * -0x5555555555555555;
      pVVar5 = (this->forces_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        local_338[2] = pVVar3[uVar10].super_Vector<double,_3U>.data_[2];
        local_338[0] = pVVar3[uVar10].super_Vector<double,_3U>.data_[0];
        local_338[1] = pVVar3[uVar10].super_Vector<double,_3U>.data_[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar1 = 0;
        padVar14 = (double (*) [3])&local_78;
        do {
          dVar18 = local_318[lVar1];
          lVar11 = 0;
          do {
            dVar18 = dVar18 + (((SquareMatrix<double,_3> *)*padVar14)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][lVar11] * local_338[lVar11]
            ;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          local_318[lVar1] = dVar18;
          lVar1 = lVar1 + 1;
          padVar14 = padVar14 + 1;
        } while (lVar1 != 3);
        local_148[0] = local_318[2] * local_2a8[1] + local_318[1] * -local_2a8[2];
        local_148[1] = local_318[0] * local_2a8[2] + local_318[2] * -local_2a8[0];
        local_148[2] = local_318[0] * -local_2a8[1] + local_2a8[0] * local_318[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar1 = 0;
        do {
          local_318[lVar1] = local_148[lVar1] * dVar17;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        local_168[2] = local_318[2];
        local_168[0] = local_318[0];
        local_168[1] = local_318[1];
        local_318[0] = 0.0;
        local_318[1] = 0.0;
        local_318[2] = 0.0;
        lVar1 = 0;
        pdVar4 = local_e8;
        do {
          dVar18 = local_318[lVar1];
          lVar11 = 0;
          do {
            dVar18 = dVar18 + pdVar4[lVar11] * local_168[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          local_318[lVar1] = dVar18;
          lVar1 = lVar1 + 1;
          pdVar4 = pdVar4 + 3;
        } while (lVar1 != 3);
        local_1d8[2] = local_318[2];
        local_1d8[0] = local_318[0];
        local_1d8[1] = local_318[1];
        dVar18 = (this->super_Restraint).scaleFactor_;
        lVar1 = 0;
        do {
          local_1d8[lVar1] = local_1d8[lVar1] * dVar18;
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        lVar1 = 0;
        do {
          pVVar5[uVar10].super_Vector<double,_3U>.data_[lVar1] =
               local_1d8[lVar1] + pVVar5[uVar10].super_Vector<double,_3U>.data_[lVar1];
          lVar1 = lVar1 + 1;
        } while (lVar1 != 3);
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
    }
    if (local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.s.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    DynamicRectMatrix<double>::deallocate(&local_128.V);
    DynamicRectMatrix<double>::deallocate(&local_128.U);
    DynamicRectMatrix<double>::deallocate(&local_268);
    if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    DynamicRectMatrix<double>::deallocate(&local_258);
    DynamicRectMatrix<double>::deallocate(&local_248);
  }
  return;
}

Assistant:

void MolecularRestraint::calcForce(std::vector<Vector3d> struc,
                                     Vector3d molCom) {
    assert(struc.size() == ref_.size());

    std::vector<Vector3d>::iterator it;

    // clear out initial values:
    pot_ = 0.0;
    for (it = forces_.begin(); it != forces_.end(); ++it)
      (*it) = 0.0;

    if (restType_ & rtDisplacement) {
      Vector3d del = molCom - refCom_;

      RealType r = del.length();
      RealType p = 0.5 * kDisp_ * r * r;

      pot_ += p;

      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += -kDisp_ * del * scaleFactor_;
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = molCom(2) - posZ0_;
      RealType p   = 0.5 * kAbs_ * r * r;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);

      pot_ += p;

      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += frc * scaleFactor_;
    }

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      Mat3x3d R(0.0);

      for (unsigned int n = 0; n < struc.size(); n++) {
        /*
         * First migrate the center of mass:
         */
        struc[n] -= molCom;

        /*
         * correlation matrix R:
         *   R(i,j) = sum(over n): y(n,i) * x(n,j)
         *   where x(n) and y(n) are two vector sets
         */

        R += outProduct(struc[n], ref_[n]);
      }

      // SVD class uses dynamic matrices, so we must wrap the correlation
      // matrix before calling SVD and then unwrap the results into Mat3x3d
      // and Vector3d before we use them.

      DynamicRectMatrix<RealType> Rtmp(3, 3, 0.0);
      DynamicRectMatrix<RealType> vtmp(3, 3);
      DynamicVector<RealType> stmp(3);
      DynamicRectMatrix<RealType> wtmp(3, 3);

      Rtmp.setSubMatrix(0, 0, R);

      // Heavy lifting goes here:

      JAMA::SVD<RealType> svd(Rtmp);

      svd.getU(vtmp);
      svd.getSingularValues(stmp);
      svd.getV(wtmp);

      Mat3x3d v;
      Vector3d s;
      Mat3x3d w_tr;

      vtmp.getSubMatrix(0, 0, v);
      stmp.getSubVector(0, s);
      wtmp.getSubMatrix(0, 0, w_tr);

      bool is_reflection = (v.determinant() * w_tr.determinant()) < 0.0;

      if (is_reflection) {
        v(2, 0) = -v(2, 0);
        v(2, 1) = -v(2, 1);
        v(2, 2) = -v(2, 2);
      }

      RotMat3x3d Atrans = v * w_tr.transpose();
      RotMat3x3d A      = Atrans.transpose();

      Quat4d quat = A.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType dVdtwist, dVdswingX, dVdswingY;
      RealType dTwist, dSwingX, dSwingY;
      RealType p;

      if (restType_ & rtTwist) {
        dTwist = twistAngle - twist0_;
        /// dVdtwist = kTwist_ * sin(dTwist) ;
        /// p = kTwist_ * (1.0 - cos(dTwist) ) ;
        dVdtwist = kTwist_ * dTwist;
        p        = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;
        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        dSwingX = swingX - swingX0_;
        /// dVdswingX = kSwingX_ * 2.0 * sin(2.0 * dSwingX);
        /// p = kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        dVdswingX = kSwingX_ * dSwingX;
        p         = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }
      if (restType_ & rtSwingY) {
        dSwingY = swingY - swingY0_;
        /// dVdswingY = kSwingY_ * 2.0 * sin(2.0 * dSwingY);
        /// p = kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        dVdswingY = kSwingY_ * dSwingY;
        p         = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      RealType t2 = dot(tBody, tBody);

      Vector3d rLab, rBody, txr, fBody, fLab;

      for (unsigned int i = 0; i < struc.size(); i++) {
        rLab  = struc[i];
        rBody = A * rLab;

        txr   = cross(tBody, rBody);
        fBody = txr * t2;
        fLab  = Atrans * fBody;
        fLab *= scaleFactor_;

        forces_[i] += fLab;
      }

      // test the force vectors and see if it is the right orientation
      //       std::cout << struc.size() << std::endl << std::endl;
      //       for (int i = 0; i != struc.size(); ++i){
      //         std::cout << "H\t" << struc[i].x() << "\t" << struc[i].y() <<
      //         "\t" << struc[i].z() << "\t"; std::cout << forces_[i].x() <<
      //         "\t"
      //         << forces_[i].y()
      //         << "\t" << forces_[i].z() << std::endl;
      //       }
    }
  }